

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::unregister(CoreBroker *this)

{
  string_view name;
  string_view name_00;
  string_view brokerName;
  string_view brokerName_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<helics::Broker> keepBrokerAlive2;
  shared_ptr<helics::Broker> keepBrokerAlive;
  __shared_ptr local_58 [32];
  __sv_type local_38;
  __sv_type local_28;
  size_t in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  pbVar2 = in_RDI;
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  brokerName._M_str = (char *)pbVar2;
  brokerName._M_len = (size_t)in_stack_fffffffffffffff0;
  BrokerFactory::findBroker(brokerName);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    local_38 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
    name._M_str = in_stack_fffffffffffffff0;
    name._M_len = in_stack_ffffffffffffffe8;
    BrokerFactory::unregisterBroker(name);
  }
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5e7656);
  if (!bVar1) {
    std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
    brokerName_00._M_str = (char *)pbVar2;
    brokerName_00._M_len = (size_t)in_stack_fffffffffffffff0;
    BrokerFactory::findBroker(brokerName_00);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_58);
    if (bVar1) {
      std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
      name_00._M_str = in_stack_fffffffffffffff0;
      name_00._M_len = in_stack_ffffffffffffffe8;
      BrokerFactory::unregisterBroker(name_00);
    }
    CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x5e76f1);
  }
  CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x5e76fb);
  return;
}

Assistant:

void CoreBroker::unregister()
{
    /*We need to ensure that the destructor is not called immediately upon calling unregister
    otherwise this would be a mess and probably cause segmentation faults so we capture it in a
    local variable that will be destroyed on function exit
    */
    auto keepBrokerAlive = BrokerFactory::findBroker(identifier);
    if (keepBrokerAlive) {
        BrokerFactory::unregisterBroker(identifier);
    }
    if (!mPreviousLocalBrokerIdentifier.empty()) {
        auto keepBrokerAlive2 = BrokerFactory::findBroker(mPreviousLocalBrokerIdentifier);
        if (keepBrokerAlive2) {
            BrokerFactory::unregisterBroker(mPreviousLocalBrokerIdentifier);
        }
    }
}